

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

spirv_cross * __thiscall
spirv_cross::
join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[4],char_const(&)[12],std::__cxx11::string,char_const(&)[13]>
          (spirv_cross *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts,
          char (*ts_1) [2],basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2,
          char (*ts_3) [4],char (*ts_4) [12],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_5,char (*ts_6) [13])

{
  undefined1 local_1128 [8];
  StringStream<4096UL,_4096UL> stream;
  char (*ts_local_4) [12];
  char (*ts_local_3) [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_local_2;
  char (*ts_local_1) [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_local;
  
  stream.saved_buffers.stack_storage.aligned_char._184_8_ = ts_4;
  StringStream<4096UL,_4096UL>::StringStream((StringStream<4096UL,_4096UL> *)local_1128);
  inner::
  join_helper<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[4],char_const(&)[12],std::__cxx11::string,char_const(&)[13]>
            ((StringStream<4096UL,_4096UL> *)local_1128,ts,ts_1,ts_2,ts_3,
             (char (*) [12])stream.saved_buffers.stack_storage.aligned_char._184_8_,ts_5,ts_6);
  StringStream<4096ul,4096ul>::str_abi_cxx11_((StringStream<4096ul,4096ul> *)this);
  StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1128);
  return this;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}